

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O0

DdNode * cuddAddOuterSumRecur(DdManager *dd,DdNode *M,DdNode *r,DdNode *c)

{
  DdManager *pDVar1;
  DdManager *E;
  DdManager *local_b8;
  DdHalfWord local_ac;
  DdHalfWord local_a8;
  DdHalfWord local_a4;
  DdHalfWord local_a0;
  DdHalfWord local_9c;
  DdHalfWord local_98;
  int index;
  int v;
  int topr;
  int topc;
  int topM;
  DdNode *Re;
  DdNode *Rt;
  DdNode *ce;
  DdNode *ct;
  DdNode *re;
  DdNode *rt;
  DdNode *Me;
  DdNode *Mt;
  DdNode *R;
  DdNode *P;
  DdNode *c_local;
  DdNode *r_local;
  DdNode *M_local;
  DdManager *dd_local;
  
  dd_local = (DdManager *)M;
  if ((r != dd->plusinfinity) && (c != dd->plusinfinity)) {
    if ((c->index == 0x7fffffff) && (r->index == 0x7fffffff)) {
      pDVar1 = (DdManager *)
               cuddUniqueConst(dd,*(double *)(((ulong)c & 0xfffffffffffffffe) + 0x10) +
                                  *(double *)(((ulong)r & 0xfffffffffffffffe) + 0x10));
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
      if (M->index == 0x7fffffff) {
        if ((M->type).value < (pDVar1->sentinel).type.value) {
          Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
          dd_local = pDVar1;
        }
      }
      else {
        dd_local = (DdManager *)Cudd_addApply(dd,Cudd_addMinimum,(DdNode *)pDVar1,M);
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
      }
    }
    else {
      dd_local = (DdManager *)cuddCacheLookup(dd,0x6e,M,r,c);
      if (dd_local == (DdManager *)0x0) {
        if (M->index == 0x7fffffff) {
          local_98 = M->index;
        }
        else {
          local_98 = dd->perm[M->index];
        }
        if (r->index == 0x7fffffff) {
          local_9c = r->index;
        }
        else {
          local_9c = dd->perm[r->index];
        }
        if (c->index == 0x7fffffff) {
          local_a0 = c->index;
        }
        else {
          local_a0 = dd->perm[c->index];
        }
        if ((int)local_a0 < (int)local_9c) {
          local_a4 = local_a0;
        }
        else {
          local_a4 = local_9c;
        }
        if ((int)local_a4 < (int)local_98) {
          if ((int)local_a0 < (int)local_9c) {
            local_a8 = local_a0;
          }
          else {
            local_a8 = local_9c;
          }
          local_ac = local_a8;
        }
        else {
          local_ac = local_98;
        }
        rt = M;
        Me = M;
        if (local_98 == local_ac) {
          Me = (M->type).kids.T;
          rt = (M->type).kids.E;
        }
        ct = r;
        re = r;
        if (local_9c == local_ac) {
          re = (r->type).kids.T;
          ct = (r->type).kids.E;
        }
        Rt = c;
        ce = c;
        if (local_a0 == local_ac) {
          ce = (c->type).kids.T;
          Rt = (c->type).kids.E;
        }
        pDVar1 = (DdManager *)cuddAddOuterSumRecur(dd,Me,re,ce);
        if (pDVar1 == (DdManager *)0x0) {
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          E = (DdManager *)cuddAddOuterSumRecur(dd,rt,ct,Rt);
          if (E == (DdManager *)0x0) {
            Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
            local_b8 = pDVar1;
            if (pDVar1 != E) {
              local_b8 = (DdManager *)
                         cuddUniqueInter(dd,dd->invperm[(int)local_ac],(DdNode *)pDVar1,(DdNode *)E)
              ;
            }
            if (local_b8 == (DdManager *)0x0) {
              Cudd_RecursiveDeref(dd,(DdNode *)pDVar1);
              Cudd_RecursiveDeref(dd,(DdNode *)E);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
              *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
              cuddCacheInsert(dd,0x6e,M,r,c,&local_b8->sentinel);
              dd_local = local_b8;
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
cuddAddOuterSumRecur(
  DdManager *dd,
  DdNode *M,
  DdNode *r,
  DdNode *c)
{
    DdNode *P, *R, *Mt, *Me, *rt, *re, *ct, *ce, *Rt, *Re;
    int topM, topc, topr;
    int v, index;

    statLine(dd);
    /* Check special cases. */
    if (r == DD_PLUS_INFINITY(dd) || c == DD_PLUS_INFINITY(dd)) return(M); 

    if (cuddIsConstant(c) && cuddIsConstant(r)) {
        R = cuddUniqueConst(dd,Cudd_V(c)+Cudd_V(r));
        cuddRef(R);
        if (cuddIsConstant(M)) {
            if (cuddV(R) <= cuddV(M)) {
                cuddDeref(R);
                return(R);
            } else {
                Cudd_RecursiveDeref(dd,R);       
                return(M);
            }
        } else {
            P = Cudd_addApply(dd,Cudd_addMinimum,R,M);
            cuddRef(P);
            Cudd_RecursiveDeref(dd,R);
            cuddDeref(P);
            return(P);
        }
    }

    /* Check the cache. */
    R = cuddCacheLookup(dd,DD_ADD_OUT_SUM_TAG,M,r,c);
    if (R != NULL) return(R);

    topM = cuddI(dd,M->index); topr = cuddI(dd,r->index);
    topc = cuddI(dd,c->index);
    v = ddMin(topM,ddMin(topr,topc));

    /* Compute cofactors. */
    if (topM == v) { Mt = cuddT(M); Me = cuddE(M); } else { Mt = Me = M; }
    if (topr == v) { rt = cuddT(r); re = cuddE(r); } else { rt = re = r; }
    if (topc == v) { ct = cuddT(c); ce = cuddE(c); } else { ct = ce = c; }

    /* Recursively solve. */
    Rt = cuddAddOuterSumRecur(dd,Mt,rt,ct);
    if (Rt == NULL) return(NULL);
    cuddRef(Rt);
    Re = cuddAddOuterSumRecur(dd,Me,re,ce);
    if (Re == NULL) {
        Cudd_RecursiveDeref(dd, Rt);
        return(NULL);
    }
    cuddRef(Re);
    index = dd->invperm[v];
    R = (Rt == Re) ? Rt : cuddUniqueInter(dd,index,Rt,Re);
    if (R == NULL) {
        Cudd_RecursiveDeref(dd, Rt);
        Cudd_RecursiveDeref(dd, Re);
        return(NULL);
    }
    cuddDeref(Rt);
    cuddDeref(Re);

    /* Store the result in the cache. */
    cuddCacheInsert(dd,DD_ADD_OUT_SUM_TAG,M,r,c,R);

    return(R);

}